

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

void __thiscall ON_PostEffect::ON_PostEffect(ON_PostEffect *this,ON_PostEffect *pep)

{
  Types t;
  CImpl *this_00;
  wchar_t *n;
  undefined4 extraout_var;
  ON_wString OStack_38;
  ON_UUID local_30;
  
  this->_vptr_ON_PostEffect = (_func_int **)&PTR__ON_PostEffect_0082a4a8;
  this_00 = (CImpl *)operator_new(0x30);
  (*pep->_vptr_ON_PostEffect[7])(&OStack_38);
  n = ON_wString::operator_cast_to_wchar_t_(&OStack_38);
  local_30.Data1 = (*pep->_vptr_ON_PostEffect[6])(pep);
  local_30._4_4_ = extraout_var;
  t = (*pep->_vptr_ON_PostEffect[5])(pep);
  CImpl::CImpl(this_00,(ON_PostEffects *)0x0,n,&local_30,t);
  this->_impl = this_00;
  ON_wString::~ON_wString(&OStack_38);
  (*this->_vptr_ON_PostEffect[2])(this,pep);
  return;
}

Assistant:

ON_PostEffect::ON_PostEffect(const ON_PostEffect& pep)
{
  _impl = new CImpl(nullptr, pep.LocalName(), pep.Id(), pep.Type());
  operator = (pep);
}